

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void make_size_image(png_store *ps,png_byte colour_type,png_byte bit_depth,int interlace_type,
                    png_uint_32 w,png_uint_32 h,int do_interlace)

{
  jmp_buf *pa_Var1;
  int iVar2;
  png_uint_32 id_00;
  uint pixel_size_00;
  int iVar3;
  uint uVar4;
  png_structp png_ptr;
  size_t sVar5;
  uint uVar6;
  byte local_af0;
  byte local_ae4;
  undefined1 local_ad8 [8];
  png_text text_1;
  png_byte local_a98 [4];
  int filters;
  png_byte tempRow [128];
  png_const_bytep row;
  png_byte local_a08 [4];
  png_uint_32 wPass;
  png_byte image [16] [128];
  uint local_200;
  int pass;
  png_uint_32 y;
  int npasses;
  char copy [64];
  undefined1 local_1b0 [8];
  png_text text;
  size_t pos;
  char local_168 [4];
  png_uint_32 id;
  char name [64];
  uint pixel_size;
  png_structp pp;
  png_infop pi;
  jmp_buf exception__env;
  jmp_buf *exception__prev;
  png_store *fault;
  exception_context *the_exception_context;
  png_uint_32 h_local;
  png_uint_32 w_local;
  int interlace_type_local;
  png_byte bit_depth_local;
  png_byte colour_type_local;
  png_store *ps_local;
  
  pa_Var1 = (ps->exception_context).penv;
  (ps->exception_context).penv = (jmp_buf *)&pi;
  iVar2 = _setjmp((__jmp_buf_tag *)&pi);
  if (iVar2 == 0) {
    do {
      id_00 = (uint)colour_type + (uint)bit_depth * 8 + interlace_type * 0x2000 +
              (uint)(do_interlace != 0) * 0x8000 + w * 0x10000 + h * 0x1000000;
      standard_name_from_id(local_168,0x40,0,id_00);
      png_ptr = set_store_for_write(ps,(png_infopp)&pp,local_168);
      if (png_ptr == (png_structp)0x0) {
        (ps->exception_context).v.etmp = ps;
        longjmp((__jmp_buf_tag *)(ps->exception_context).penv,1);
      }
      png_set_IHDR(png_ptr,(png_inforp)pp,w,h,(uint)bit_depth,(uint)colour_type,interlace_type,0,0);
      local_1b0._0_4_ = 0;
      text._0_8_ = make_size_image::key;
      text.text = (png_charp)safecat((char *)&y,0x40,0,ps->wname);
      text.key = (png_charp)&y;
      text.text_length = 0;
      text.itxt_length = 0;
      text.lang = (png_charp)0x0;
      text.lang_key = text.text;
      png_set_text(png_ptr,(png_inforp)pp,(png_const_textp)local_1b0,1);
      if (colour_type == '\x03') {
        init_standard_palette(ps,png_ptr,(png_infop)pp,1 << (bit_depth & 0x1f),0);
      }
      png_write_info(png_ptr,(png_const_inforp)pp);
      pixel_size_00 = bit_size(png_ptr,colour_type,bit_depth);
      sVar5 = png_get_rowbytes(png_ptr,(png_const_inforp)pp);
      if (sVar5 != w * pixel_size_00 + 7 >> 3) {
        png_error(png_ptr,"size row size incorrect");
      }
      iVar2 = npasses_from_interlace_type(png_ptr,interlace_type);
      memset(local_a08,0xff,0x800);
      if ((do_interlace == 0) && (iVar3 = png_set_interlace_handling(png_ptr), iVar2 != iVar3)) {
        png_error(png_ptr,"write: png_set_interlace_handling failed");
      }
      for (local_200 = 0; local_200 < h; local_200 = local_200 + 1) {
        size_row(local_a08 + (ulong)local_200 * 0x80,w * pixel_size_00,local_200);
      }
      image[0xf][0x7c] = '\0';
      image[0xf][0x7d] = '\0';
      image[0xf][0x7e] = '\0';
      image[0xf][0x7f] = '\0';
      for (; (int)image[0xf]._124_4_ < iVar2; image[0xf]._124_4_ = image[0xf]._124_4_ + 1) {
        if ((int)image[0xf]._124_4_ < 2) {
          local_ae4 = 3;
        }
        else {
          local_ae4 = (byte)(7 - image[0xf]._124_4_ >> 1);
        }
        uVar6 = image[0xf]._124_4_ & 1;
        iVar3 = image[0xf]._124_4_ + 1;
        if ((int)image[0xf]._124_4_ < 2) {
          local_af0 = 3;
        }
        else {
          local_af0 = (byte)(7 - image[0xf]._124_4_ >> 1);
        }
        for (local_200 = 0; local_200 < h; local_200 = local_200 + 1) {
          tempRow._120_8_ = local_a08 + (ulong)local_200 * 0x80;
          if ((do_interlace == 0) || (interlace_type != 1)) {
LAB_00117e66:
            uVar4 = random_mod(5);
            text_1.lang_key._4_4_ = 8 << ((byte)uVar4 & 0x1f);
            if (((image[0xf]._124_4_ == 0) && (local_200 == 0)) &&
               (((int)text_1.lang_key._4_4_ < 0x20 || (w == 1)))) {
              text_1.lang_key._4_4_ = text_1.lang_key._4_4_ | 0x20;
            }
            png_set_filter(png_ptr,0,text_1.lang_key._4_4_);
            png_write_row(png_ptr,(png_const_bytep)tempRow._120_8_);
          }
          else if ((((int)(0x110145af >> (('\a' - (png_byte)image[0xf]._124_4_) * '\x04' & 0x1f) &
                           0xfU | 0x1145af0 >>
                                  (('\a' - (png_byte)image[0xf]._124_4_) * '\x04' & 0x1f) & 0xf0U)
                     >> ((byte)local_200 & 7) & 1U) != 0) &&
                  (w + (((1 << (local_ae4 & 0x1f)) + -1) -
                       (uVar6 << (3U - (char)(iVar3 >> 1) & 0x1f) & 7)) >> (local_af0 & 0x1f) != 0))
          {
            memset(local_a98,0xff,0x80);
            interlace_row(local_a98,(png_const_bytep)tempRow._120_8_,pixel_size_00,w,
                          image[0xf]._124_4_,0);
            tempRow._120_8_ = local_a98;
            goto LAB_00117e66;
          }
        }
      }
      local_ad8._0_4_ = 0;
      text_1._0_8_ = make_size_image::key_1;
      text_1.key = make_size_image::comment;
      text_1.text = (png_charp)0x3;
      text_1.text_length = 0;
      text_1.itxt_length = 0;
      text_1.lang = (png_charp)0x0;
      png_set_text(png_ptr,(png_inforp)pp,(png_const_textp)local_ad8,1);
      png_write_end(png_ptr,(png_inforp)pp);
      store_storefile(ps,id_00);
      store_write_reset(ps);
      (ps->exception_context).caught = 0;
    } while ((ps->exception_context).caught != 0);
  }
  else {
    (ps->exception_context).caught = 1;
  }
  (ps->exception_context).penv = pa_Var1;
  if ((ps->exception_context).caught != 0) {
    store_write_reset((ps->exception_context).v.etmp);
  }
  return;
}

Assistant:

static void
make_size_image(png_store* const ps, png_byte const colour_type,
    png_byte const bit_depth, int const interlace_type,
    png_uint_32 const w, png_uint_32 const h,
    int const do_interlace)
{
   context(ps, fault);

   check_interlace_type(interlace_type);

   Try
   {
      png_infop pi;
      png_structp pp;
      unsigned int pixel_size;

      /* Make a name and get an appropriate id for the store: */
      char name[FILE_NAME_SIZE];
      png_uint_32 id = FILEID(colour_type, bit_depth, 0/*palette*/,
         interlace_type, w, h, do_interlace);

      standard_name_from_id(name, sizeof name, 0, id);
      pp = set_store_for_write(ps, &pi, name);

      /* In the event of a problem return control to the Catch statement below
       * to do the clean up - it is not possible to 'return' directly from a Try
       * block.
       */
      if (pp == NULL)
         Throw ps;

      png_set_IHDR(pp, pi, w, h, bit_depth, colour_type, interlace_type,
         PNG_COMPRESSION_TYPE_BASE, PNG_FILTER_TYPE_BASE);

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "image name"; /* must be writeable */
         size_t pos;
         png_text text;
         char copy[FILE_NAME_SIZE];

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         /* Yuck: the text must be writable! */
         pos = safecat(copy, sizeof copy, 0, ps->wname);
         text.text = copy;
         text.text_length = pos;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      if (colour_type == 3) /* palette */
         init_standard_palette(ps, pp, pi, 1U << bit_depth, 0/*do tRNS*/);

      png_write_info(pp, pi);

      /* Calculate the bit size, divide by 8 to get the byte size - this won't
       * overflow because we know the w values are all small enough even for
       * a system where 'unsigned int' is only 16 bits.
       */
      pixel_size = bit_size(pp, colour_type, bit_depth);
      if (png_get_rowbytes(pp, pi) != ((w * pixel_size) + 7) / 8)
         png_error(pp, "size row size incorrect");

      else
      {
         int npasses = npasses_from_interlace_type(pp, interlace_type);
         png_uint_32 y;
         int pass;
         png_byte image[16][SIZE_ROWMAX];

         /* To help consistent error detection make the parts of this buffer
          * that aren't set below all '1':
          */
         memset(image, 0xff, sizeof image);

         if (!do_interlace &&
             npasses != set_write_interlace_handling(pp, interlace_type))
            png_error(pp, "write: png_set_interlace_handling failed");

         /* Prepare the whole image first to avoid making it 7 times: */
         for (y=0; y<h; ++y)
            size_row(image[y], w * pixel_size, y);

         for (pass=0; pass<npasses; ++pass)
         {
            /* The following two are for checking the macros: */
            png_uint_32 wPass = PNG_PASS_COLS(w, pass);

            /* If do_interlace is set we don't call png_write_row for every
             * row because some of them are empty.  In fact, for a 1x1 image,
             * most of them are empty!
             */
            for (y=0; y<h; ++y)
            {
               png_const_bytep row = image[y];
               png_byte tempRow[SIZE_ROWMAX];

               /* If do_interlace *and* the image is interlaced we
                * need a reduced interlace row; this may be reduced
                * to empty.
                */
               if (do_interlace && interlace_type == PNG_INTERLACE_ADAM7)
               {
                  /* The row must not be written if it doesn't exist, notice
                   * that there are two conditions here, either the row isn't
                   * ever in the pass or the row would be but isn't wide
                   * enough to contribute any pixels.  In fact the wPass test
                   * can be used to skip the whole y loop in this case.
                   */
                  if (PNG_ROW_IN_INTERLACE_PASS(y, pass) && wPass > 0)
                  {
                     /* Set to all 1's for error detection (libpng tends to
                      * set unset things to 0).
                      */
                     memset(tempRow, 0xff, sizeof tempRow);
                     interlace_row(tempRow, row, pixel_size, w, pass,
                           0/*data always bigendian*/);
                     row = tempRow;
                  }
                  else
                     continue;
               }

#           ifdef PNG_WRITE_FILTER_SUPPORTED
               /* Only get to here if the row has some pixels in it, set the
                * filters to 'all' for the very first row and thereafter to a
                * single filter.  It isn't well documented, but png_set_filter
                * does accept a filter number (per the spec) as well as a bit
                * mask.
                *
                * The code now uses filters at random, except that on the first
                * row of an image it ensures that a previous row filter is in
                * the set so that libpng allocates the row buffer.
                */
               {
                  int filters = 8 << random_mod(PNG_FILTER_VALUE_LAST);

                  if (pass == 0 && y == 0 &&
                      (filters < PNG_FILTER_UP || w == 1U))
                     filters |= PNG_FILTER_UP;

                  png_set_filter(pp, 0/*method*/, filters);
               }
#           endif

               png_write_row(pp, row);
            }
         }
      }

#ifdef PNG_TEXT_SUPPORTED
      {
         static char key[] = "end marker";
         static char comment[] = "end";
         png_text text;

         /* Use a compressed text string to test the correct interaction of text
          * compression and IDAT compression.
          */
         text.compression = TEXT_COMPRESSION;
         text.key = key;
         text.text = comment;
         text.text_length = (sizeof comment)-1;
         text.itxt_length = 0;
         text.lang = 0;
         text.lang_key = 0;

         png_set_text(pp, pi, &text, 1);
      }
#endif

      png_write_end(pp, pi);

      /* And store this under the appropriate id, then clean up. */
      store_storefile(ps, id);

      store_write_reset(ps);
   }

   Catch(fault)
   {
      /* Use the png_store returned by the exception. This may help the compiler
       * because 'ps' is not used in this branch of the setjmp.  Note that fault
       * and ps will always be the same value.
       */
      store_write_reset(fault);
   }
}